

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_test.cpp
# Opt level: O1

void __thiscall shared_ptr_stat_pointer_cast_Test::TestBody(shared_ptr_stat_pointer_cast_Test *this)

{
  B *pBVar1;
  shared_ptr_base sVar2;
  A *p;
  bool bVar3;
  A *pAVar4;
  AssertHelperData *pAVar5;
  char *pcVar6;
  _func_int **pp_Var7;
  long in_FS_OFFSET;
  AssertionResult gtest_ar_18;
  shared_ptr<A> a2Ptr;
  shared_ptr<B> bPtr;
  shared_ptr<A> abPtr;
  AssertionResult gtest_ar;
  shared_ptr<A> a0Ptr;
  shared_ptr<A> local_a8;
  AssertHelper local_98;
  AssertHelper local_90;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  AssertHelper local_80;
  shared_ptr<A> local_78;
  shared_ptr<B> local_68;
  shared_ptr<A> local_58;
  shared_ptr<A> local_48;
  shared_ptr<A> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  local_38.px = (A *)0x0;
  local_58.super_shared_ptr_base.pn.pn =
       (shared_ptr_count)((ulong)local_58.super_shared_ptr_base.pn.pn & 0xffffffffffffff00);
  testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
            ((internal *)&local_48,"false","a0Ptr",(bool *)&local_58,&local_38);
  if ((char)local_48.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_48.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x215,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_58.super_shared_ptr_base.pn.pn + 8))();
      }
      local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pAVar4 = (A *)operator_new(8);
  A::_mNbInstances = A::_mNbInstances + 1;
  pAVar4->_vptr_A = (_func_int **)&PTR__A_00189f50;
  local_48.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  shared_ptr_count::acquire<A>((shared_ptr_count *)&local_48,pAVar4);
  local_68.super_shared_ptr_base.pn.pn._0_1_ = 1;
  local_48.px = pAVar4;
  testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
            ((internal *)&local_58,"true","aPtr",(bool *)&local_68,&local_48);
  if ((char)local_58.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_68);
    if (local_58.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_58.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x219,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_68.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_68.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_68.super_shared_ptr_base.pn.pn + 8))();
      }
      local_68.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68.super_shared_ptr_base.pn.pn._0_1_ = 1;
  if (local_48.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = *(long *)local_48.super_shared_ptr_base.pn.pn == 1;
  }
  local_78.super_shared_ptr_base.pn.pn._0_1_ = bVar3;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_58,"true","aPtr.unique()",(bool *)&local_68,(bool *)&local_78);
  if ((char)local_58.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_68);
    if (local_58.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_58.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x21a,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_68.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_68.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_68.super_shared_ptr_base.pn.pn + 8))();
      }
      local_68.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.super_shared_ptr_base.pn.pn._0_4_ = 1;
  if (local_48.super_shared_ptr_base.pn.pn == (long *)0x0) {
    local_68.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  }
  else {
    local_68.super_shared_ptr_base.pn.pn = *(shared_ptr_count *)local_48.super_shared_ptr_base.pn.pn
    ;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_58,"1","aPtr.use_count()",(int *)&local_78,(long *)&local_68);
  if ((char)local_58.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_68);
    if (local_58.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_58.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x21b,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_68.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_68.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_68.super_shared_ptr_base.pn.pn + 8))();
      }
      local_68.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  local_78.super_shared_ptr_base.pn.pn = (shared_ptr_count)(shared_ptr_count)local_48.px;
  testing::internal::CmpHelperNE<void*,A*>
            ((internal *)&local_58,"(void*)__null","aPtr.get()",(void **)&local_68,(A **)&local_78);
  if ((char)local_58.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_68);
    if (local_58.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_58.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x21c,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_68.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_68.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_68.super_shared_ptr_base.pn.pn + 8))();
      }
      local_68.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68.super_shared_ptr_base.pn.pn._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_58,"1","A::_mNbInstances",(int *)&local_68,&A::_mNbInstances);
  if ((char)local_58.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_68);
    if (local_58.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_58.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x21d,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_68.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_68.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_68.super_shared_ptr_base.pn.pn + 8))();
      }
      local_68.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pAVar5 = (AssertHelperData *)operator_new(8);
  A::_mNbInstances = A::_mNbInstances + 1;
  *(undefined ***)pAVar5 = &PTR__A_00189f50;
  B::_mNbInstances = B::_mNbInstances + 1;
  *(undefined ***)pAVar5 = &PTR__B_00189f08;
  local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  shared_ptr_count::acquire<A>((shared_ptr_count *)&local_58,(A *)pAVar5);
  local_78.super_shared_ptr_base.pn.pn._0_1_ = 1;
  local_58.px = (A *)pAVar5;
  testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
            ((internal *)&local_68,"true","abPtr",(bool *)&local_78,&local_58);
  if ((char)local_68.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_78);
    if (local_68.px == (B *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = ((local_68.px)->super_A)._vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x220,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_78.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_78.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_78.super_shared_ptr_base.pn.pn + 8))();
      }
      local_78.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.super_shared_ptr_base.pn.pn._0_1_ = 1;
  if (local_58.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = *(long *)local_58.super_shared_ptr_base.pn.pn == 1;
  }
  local_90.data_._0_1_ = (internal)bVar3;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_68,"true","abPtr.unique()",(bool *)&local_78,(bool *)&local_90);
  if ((char)local_68.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_78);
    if (local_68.px == (B *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = ((local_68.px)->super_A)._vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x221,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_78.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_78.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_78.super_shared_ptr_base.pn.pn + 8))();
      }
      local_78.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90.data_._0_4_ = 1;
  if (local_58.super_shared_ptr_base.pn.pn == (long *)0x0) {
    local_78.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  }
  else {
    local_78.super_shared_ptr_base.pn.pn = *(shared_ptr_count *)local_58.super_shared_ptr_base.pn.pn
    ;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_68,"1","abPtr.use_count()",(int *)&local_90,(long *)&local_78);
  if ((char)local_68.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_78);
    if (local_68.px == (B *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = ((local_68.px)->super_A)._vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x222,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_78.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_78.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_78.super_shared_ptr_base.pn.pn + 8))();
      }
      local_78.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  local_90.data_ = (AssertHelperData *)local_58.px;
  testing::internal::CmpHelperNE<void*,A*>
            ((internal *)&local_68,"(void*)__null","abPtr.get()",(void **)&local_78,(A **)&local_90)
  ;
  if ((char)local_68.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_78);
    if (local_68.px == (B *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = ((local_68.px)->super_A)._vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x223,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_78.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_78.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_78.super_shared_ptr_base.pn.pn + 8))();
      }
      local_78.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.super_shared_ptr_base.pn.pn._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_68,"2","A::_mNbInstances",(int *)&local_78,&A::_mNbInstances);
  if ((char)local_68.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_78);
    if (local_68.px == (B *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = ((local_68.px)->super_A)._vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x224,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_78.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_78.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_78.super_shared_ptr_base.pn.pn + 8))();
      }
      local_78.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.super_shared_ptr_base.pn.pn._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_68,"1","B::_mNbInstances",(int *)&local_78,&B::_mNbInstances);
  if ((char)local_68.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_78);
    if (local_68.px == (B *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = ((local_68.px)->super_A)._vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x225,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_78.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_78.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_78.super_shared_ptr_base.pn.pn + 8))();
      }
      local_78.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pAVar5 = (AssertHelperData *)operator_new(8);
  A::_mNbInstances = A::_mNbInstances + 1;
  B::_mNbInstances = B::_mNbInstances + 1;
  *(undefined ***)pAVar5 = &PTR__A_00189f50;
  *(undefined ***)pAVar5 = &PTR__B_00189f08;
  local_68.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  shared_ptr_count::acquire<B>((shared_ptr_count *)&local_68,(B *)pAVar5);
  local_90.data_._0_1_ = (internal)0x1;
  local_68.px = (B *)pAVar5;
  testing::internal::CmpHelperEQ<bool,shared_ptr<B>>
            ((internal *)&local_78,"true","bPtr",(bool *)&local_90,&local_68);
  if ((char)local_78.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_90);
    if (local_78.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_78.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x228,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_90.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_90.data_ + 8))();
      }
      local_90.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90.data_._0_1_ = (internal)0x1;
  if (local_68.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = *(long *)local_68.super_shared_ptr_base.pn.pn == 1;
  }
  local_80.data_._0_1_ = bVar3;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_78,"true","bPtr.unique()",(bool *)&local_90,(bool *)&local_80);
  if ((char)local_78.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_90);
    if (local_78.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_78.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x229,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_90.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_90.data_ + 8))();
      }
      local_90.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.data_._0_4_ = 1;
  if (local_68.super_shared_ptr_base.pn.pn == (long *)0x0) {
    local_90.data_ = (AssertHelperData *)0x0;
  }
  else {
    local_90.data_ = *(AssertHelperData **)local_68.super_shared_ptr_base.pn.pn;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_78,"1","bPtr.use_count()",(int *)&local_80,(long *)&local_90);
  if ((char)local_78.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_90);
    if (local_78.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_78.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x22a,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_90.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_90.data_ + 8))();
      }
      local_90.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90.data_ = (AssertHelperData *)0x0;
  local_80.data_ = (AssertHelperData *)local_68.px;
  testing::internal::CmpHelperNE<void*,B*>
            ((internal *)&local_78,"(void*)__null","bPtr.get()",&local_90.data_,(B **)&local_80);
  if ((char)local_78.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_90);
    if (local_78.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_78.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x22b,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_90.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_90.data_ + 8))();
      }
      local_90.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_78,"3","A::_mNbInstances",(int *)&local_90,&A::_mNbInstances);
  if ((char)local_78.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_90);
    if (local_78.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_78.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x22c,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_90.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_90.data_ + 8))();
      }
      local_90.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_78,"2","B::_mNbInstances",(int *)&local_90,&B::_mNbInstances);
  if ((char)local_78.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_90);
    if (local_78.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_78.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x22d,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_90.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_90.data_ + 8))();
      }
      local_90.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pBVar1 = local_68.px;
  local_78.super_shared_ptr_base.pn.pn = local_68.super_shared_ptr_base.pn.pn;
  shared_ptr_count::acquire<A>((shared_ptr_count *)&local_78,&(local_68.px)->super_A);
  local_78.px = &pBVar1->super_A;
  local_80.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
            ((internal *)&local_90,"true","a2Ptr",(bool *)&local_80,&local_78);
  if (local_90.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x231,pcVar6);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_80.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_80.data_ + 8))();
      }
      local_80.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.data_ = local_80.data_ & 0xffffffffffffff00;
  if (local_78.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = *(long *)local_78.super_shared_ptr_base.pn.pn == 1;
  }
  local_98.data_._0_1_ = bVar3;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_90,"false","a2Ptr.unique()",(bool *)&local_80,(bool *)&local_98);
  if (local_90.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x232,pcVar6);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_80.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_80.data_ + 8))();
      }
      local_80.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.data_._0_4_ = 2;
  if (local_78.super_shared_ptr_base.pn.pn == (long *)0x0) {
    local_80.data_ = (AssertHelperData *)0x0;
  }
  else {
    local_80.data_ = *(AssertHelperData **)local_78.super_shared_ptr_base.pn.pn;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_90,"2","a2Ptr.use_count()",(int *)&local_98,(long *)&local_80);
  if (local_90.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x233,pcVar6);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_80.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_80.data_ + 8))();
      }
      local_80.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.data_ = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_78.px;
  testing::internal::CmpHelperNE<void*,A*>
            ((internal *)&local_90,"(void*)__null","a2Ptr.get()",&local_80.data_,(A **)&local_98);
  if (local_90.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x234,pcVar6);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_80.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_80.data_ + 8))();
      }
      local_80.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_90,"3","A::_mNbInstances",(int *)&local_80,&A::_mNbInstances);
  if (local_90.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x235,pcVar6);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_80.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_80.data_ + 8))();
      }
      local_80.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_90,"2","B::_mNbInstances",(int *)&local_80,&B::_mNbInstances);
  if (local_90.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x236,pcVar6);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_80.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_80.data_ + 8))();
      }
      local_80.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  shared_ptr<A>::shared_ptr(&local_a8,&local_78);
  p = local_38.px;
  sVar2.pn.pn = local_38.super_shared_ptr_base.pn.pn;
  pAVar4 = local_a8.px;
  local_a8.px = local_38.px;
  local_38.super_shared_ptr_base.pn.pn = local_a8.super_shared_ptr_base.pn.pn;
  local_38.px = pAVar4;
  local_a8.super_shared_ptr_base.pn.pn = sVar2.pn.pn;
  shared_ptr_count::release<A>((shared_ptr_count *)&local_a8,p);
  local_a8.px = (A *)0x0;
  local_98.data_._0_4_ = 3;
  if (local_38.super_shared_ptr_base.pn.pn == (long *)0x0) {
    local_80.data_ = (AssertHelperData *)0x0;
  }
  else {
    local_80.data_ = *(AssertHelperData **)local_38.super_shared_ptr_base.pn.pn;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_90,"3","a0Ptr.use_count()",(int *)&local_98,(long *)&local_80);
  if (local_90.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x23a,pcVar6);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_80.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_80.data_ + 8))();
      }
      local_80.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  shared_ptr_count::release<A>((shared_ptr_count *)&local_78,local_78.px);
  shared_ptr_count::release<B>((shared_ptr_count *)&local_68,local_68.px);
  shared_ptr_count::release<A>((shared_ptr_count *)&local_58,local_58.px);
  shared_ptr_count::release<A>((shared_ptr_count *)&local_48,local_48.px);
  local_58.super_shared_ptr_base.pn.pn._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
            ((internal *)&local_48,"true","a0Ptr",(bool *)&local_58,&local_38);
  if ((char)local_48.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_48.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x23d,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_58.super_shared_ptr_base.pn.pn + 8))();
      }
      local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.super_shared_ptr_base.pn.pn._0_1_ = 1;
  if (local_38.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = *(long *)local_38.super_shared_ptr_base.pn.pn == 1;
  }
  local_68.super_shared_ptr_base.pn.pn._0_1_ = bVar3;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_48,"true","a0Ptr.unique()",(bool *)&local_58,(bool *)&local_68);
  if ((char)local_48.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_48.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x23e,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_58.super_shared_ptr_base.pn.pn + 8))();
      }
      local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68.super_shared_ptr_base.pn.pn._0_4_ = 1;
  if (local_38.super_shared_ptr_base.pn.pn == (long *)0x0) {
    local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  }
  else {
    local_58.super_shared_ptr_base.pn.pn = *(shared_ptr_count *)local_38.super_shared_ptr_base.pn.pn
    ;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_48,"1","a0Ptr.use_count()",(int *)&local_68,(long *)&local_58);
  if ((char)local_48.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_48.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x23f,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_58.super_shared_ptr_base.pn.pn + 8))();
      }
      local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  local_68.super_shared_ptr_base.pn.pn = (shared_ptr_count)(shared_ptr_count)local_38.px;
  testing::internal::CmpHelperNE<void*,A*>
            ((internal *)&local_48,"(void*)__null","a0Ptr.get()",(void **)&local_58,(A **)&local_68)
  ;
  if ((char)local_48.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_48.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x240,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_58.super_shared_ptr_base.pn.pn + 8))();
      }
      local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.super_shared_ptr_base.pn.pn._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_48,"1","A::_mNbInstances",(int *)&local_58,&A::_mNbInstances);
  if ((char)local_48.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_48.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x241,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_58.super_shared_ptr_base.pn.pn + 8))();
      }
      local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.super_shared_ptr_base.pn.pn._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_48,"1","B::_mNbInstances",(int *)&local_58,&B::_mNbInstances);
  if ((char)local_48.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_48.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x242,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_58.super_shared_ptr_base.pn.pn + 8))();
      }
      local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  shared_ptr_count::release<A>((shared_ptr_count *)&local_38,local_38.px);
  local_38.px = (A *)0x0;
  local_58.super_shared_ptr_base.pn.pn =
       (shared_ptr_count)((ulong)local_58.super_shared_ptr_base.pn.pn & 0xffffffffffffff00);
  testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
            ((internal *)&local_48,"false","a0Ptr",(bool *)&local_58,&local_38);
  if ((char)local_48.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_48.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x246,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_58.super_shared_ptr_base.pn.pn + 8))();
      }
      local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.super_shared_ptr_base.pn.pn =
       (shared_ptr_count)((ulong)local_58.super_shared_ptr_base.pn.pn & 0xffffffffffffff00);
  if (local_38.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = *(long *)local_38.super_shared_ptr_base.pn.pn == 1;
  }
  local_68.super_shared_ptr_base.pn.pn._0_1_ = bVar3;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_48,"false","a0Ptr.unique()",(bool *)&local_58,(bool *)&local_68);
  if ((char)local_48.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_48.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x247,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_58.super_shared_ptr_base.pn.pn + 8))();
      }
      local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68.super_shared_ptr_base.pn.pn =
       (shared_ptr_count)((ulong)local_68.super_shared_ptr_base.pn.pn & 0xffffffff00000000);
  if (local_38.super_shared_ptr_base.pn.pn == (long *)0x0) {
    local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  }
  else {
    local_58.super_shared_ptr_base.pn.pn = *(shared_ptr_count *)local_38.super_shared_ptr_base.pn.pn
    ;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_48,"0","a0Ptr.use_count()",(int *)&local_68,(long *)&local_58);
  if ((char)local_48.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_48.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x248,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_58.super_shared_ptr_base.pn.pn + 8))();
      }
      local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  local_68.super_shared_ptr_base.pn.pn = (shared_ptr_count)(shared_ptr_count)local_38.px;
  testing::internal::CmpHelperEQ<void*,A*>
            ((internal *)&local_48,"(void*)__null","a0Ptr.get()",(void **)&local_58,(A **)&local_68)
  ;
  if ((char)local_48.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_48.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x249,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_58.super_shared_ptr_base.pn.pn + 8))();
      }
      local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.super_shared_ptr_base.pn.pn =
       (shared_ptr_count)((ulong)local_58.super_shared_ptr_base.pn.pn & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_48,"0","A::_mNbInstances",(int *)&local_58,&A::_mNbInstances);
  if ((char)local_48.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_48.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x24a,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_58.super_shared_ptr_base.pn.pn + 8))();
      }
      local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.super_shared_ptr_base.pn.pn =
       (shared_ptr_count)((ulong)local_58.super_shared_ptr_base.pn.pn & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_48,"0","B::_mNbInstances",(int *)&local_58,&B::_mNbInstances);
  if ((char)local_48.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1726ae;
    }
    else {
      pp_Var7 = (local_48.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x24b,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_58.super_shared_ptr_base.pn.pn + 8))();
      }
      local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  shared_ptr_count::release<A>((shared_ptr_count *)&local_38,local_38.px);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TEST(shared_ptr, stat_pointer_cast)
{
   shared_ptr<A> a0Ptr;
   EXPECT_EQ(false, a0Ptr);

   {
      shared_ptr<A> aPtr(new A);
      EXPECT_EQ(true, aPtr);
      EXPECT_EQ(true, aPtr.unique());
      EXPECT_EQ(1, aPtr.use_count());
      EXPECT_NE((void*)NULL, aPtr.get());
      EXPECT_EQ(1, A::_mNbInstances);

      shared_ptr<A> abPtr(new B);
      EXPECT_EQ(true, abPtr);
      EXPECT_EQ(true, abPtr.unique());
      EXPECT_EQ(1, abPtr.use_count());
      EXPECT_NE((void*)NULL, abPtr.get());
      EXPECT_EQ(2, A::_mNbInstances);
      EXPECT_EQ(1, B::_mNbInstances);

      shared_ptr<B> bPtr(new B);
      EXPECT_EQ(true, bPtr);
      EXPECT_EQ(true, bPtr.unique());
      EXPECT_EQ(1, bPtr.use_count());
      EXPECT_NE((void*)NULL, bPtr.get());
      EXPECT_EQ(3, A::_mNbInstances);
      EXPECT_EQ(2, B::_mNbInstances);

      // static cast
      shared_ptr<A> a2Ptr = static_pointer_cast<A>(bPtr);
      EXPECT_EQ(true, a2Ptr);
      EXPECT_EQ(false, a2Ptr.unique());
      EXPECT_EQ(2, a2Ptr.use_count());
      EXPECT_NE((void*)NULL, a2Ptr.get());
      EXPECT_EQ(3, A::_mNbInstances);
      EXPECT_EQ(2, B::_mNbInstances);

      // memorize a2Ptr
      a0Ptr = a2Ptr;
      EXPECT_EQ(3, a0Ptr.use_count());
   }
   // after release of the aPtr and bPtr : only abPtr converted to a2Ptr survived through a0Ptr
   EXPECT_EQ(true, a0Ptr);
   EXPECT_EQ(true, a0Ptr.unique());
   EXPECT_EQ(1, a0Ptr.use_count());
   EXPECT_NE((void*)NULL, a0Ptr.get());
   EXPECT_EQ(1, A::_mNbInstances);
   EXPECT_EQ(1, B::_mNbInstances);

   // release the last one
   a0Ptr.reset();
   EXPECT_EQ(false, a0Ptr);
   EXPECT_EQ(false, a0Ptr.unique());
   EXPECT_EQ(0,     a0Ptr.use_count());
   EXPECT_EQ((void*)NULL,  a0Ptr.get());
   EXPECT_EQ(0,     A::_mNbInstances);
   EXPECT_EQ(0,     B::_mNbInstances);
}